

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9PSig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  uint fSetReset;
  char *pcVar2;
  
  Extra_UtilGetoptReset();
  fSetReset = 1;
  while (iVar1 = Extra_UtilGetopt(argc,argv,"rh"), iVar1 == 0x72) {
    fSetReset = fSetReset ^ 1;
  }
  if (iVar1 == -1) {
    p = pAbc->pGia;
    if (p == (Gia_Man_t *)0x0) {
      pcVar2 = "Abc_CommandAbc9PSigs(): There is no AIG.\n";
    }
    else {
      if (p->nRegs != 0) {
        Gia_ManDetectSeqSignals(p,fSetReset,1);
        return 0;
      }
      pcVar2 = "Abc_CommandAbc9PSigs(): Works only for sequential circuits.\n";
    }
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: &psig [-rh]\n");
    Abc_Print(-2,"\t         prints enable/set/reset statistics\n");
    pcVar2 = "yes";
    if (fSetReset == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-r     : toggle printing set/reset signals [default = %s]\n",pcVar2);
    pcVar2 = "\t-h     : print the command usage\n";
  }
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandAbc9PSig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    int fSetReset = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fSetReset ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9PSigs(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9PSigs(): Works only for sequential circuits.\n" );
        return 1;
    }
    Gia_ManDetectSeqSignals( pAbc->pGia, fSetReset, 1 );
    return 0;

usage:
    Abc_Print( -2, "usage: &psig [-rh]\n" );
    Abc_Print( -2, "\t         prints enable/set/reset statistics\n" );
    Abc_Print( -2, "\t-r     : toggle printing set/reset signals [default = %s]\n", fSetReset? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}